

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

void g_hash_table_insert_internal
               (GHashTable *hash_table,gpointer key,gpointer value,gboolean keep_new_key)

{
  GDestroyNotify p_Var1;
  bool bVar2;
  guint gVar3;
  gboolean gVar4;
  GHashNode *pGVar5;
  GHashNode *pGVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((hash_table != (GHashTable *)0x0) && (hash_table->ref_count != 0)) {
    gVar3 = (*hash_table->hash_func)(key);
    uVar10 = 2;
    if (2 < gVar3) {
      uVar10 = (ulong)gVar3;
    }
    uVar11 = uVar10 % (ulong)(uint)hash_table->mod;
    uVar8 = 0;
    pGVar6 = hash_table->nodes;
    pGVar5 = pGVar6 + uVar11;
    iVar9 = 1;
    bVar2 = false;
    while( true ) {
      gVar3 = pGVar5->key_hash;
      if (gVar3 == 0) break;
      if (gVar3 == (guint)uVar10) {
        if (hash_table->key_equal_func == (GEqualFunc)0x0) {
          if (pGVar5->key == key) goto LAB_00498462;
        }
        else {
          gVar4 = (*hash_table->key_equal_func)(pGVar5->key,key);
          pGVar6 = hash_table->nodes;
          if (gVar4 != 0) goto LAB_00498462;
        }
      }
      else {
        if (gVar3 == 1 && !bVar2) {
          uVar8 = uVar11;
        }
        if (gVar3 == 1 && !bVar2) {
          bVar2 = true;
        }
      }
      uVar11 = (ulong)((uint)uVar11 + iVar9 & hash_table->mask);
      pGVar5 = pGVar6 + uVar11;
      iVar9 = iVar9 + 1;
    }
    uVar7 = (uint)uVar8;
    if (!bVar2) {
      uVar7 = (uint)uVar11;
    }
    uVar11 = (ulong)uVar7;
LAB_00498462:
    pGVar5 = pGVar6 + uVar11;
    uVar7 = pGVar6[uVar11].key_hash;
    if (uVar7 < 2) {
      pGVar5->key = key;
      pGVar5->value = value;
      pGVar5->key_hash = (guint)uVar10;
      hash_table->nnodes = hash_table->nnodes + 1;
      if (uVar7 == 0) {
        hash_table->noccupied = hash_table->noccupied + 1;
        g_hash_table_maybe_resize(hash_table);
        return;
      }
    }
    else {
      p_Var1 = hash_table->key_destroy_func;
      if (keep_new_key == 0) {
        if (p_Var1 != (GDestroyNotify)0x0) {
          (*p_Var1)(key);
        }
      }
      else {
        if (p_Var1 != (GDestroyNotify)0x0) {
          (*p_Var1)(pGVar5->key);
        }
        pGVar5->key = key;
      }
      if (hash_table->value_destroy_func != (GDestroyNotify)0x0) {
        (*hash_table->value_destroy_func)(pGVar5->value);
      }
      pGVar5->value = value;
    }
  }
  return;
}

Assistant:

static void g_hash_table_insert_internal (GHashTable *hash_table,
        gpointer    key,
        gpointer    value,
        gboolean    keep_new_key)
{
    GHashNode *node;
    guint node_index;
    guint key_hash;
    guint old_hash;

    if (hash_table == NULL) return;
    if (hash_table->ref_count == 0) return;

    node_index = g_hash_table_lookup_node_for_insertion (hash_table, key, &key_hash);
    node = &hash_table->nodes [node_index];

    old_hash = node->key_hash;

    if (old_hash > 1)
    {
        if (keep_new_key)
        {
            if (hash_table->key_destroy_func)
                hash_table->key_destroy_func (node->key);
            node->key = key;
        }
        else
        {
            if (hash_table->key_destroy_func)
                hash_table->key_destroy_func (key);
        }

        if (hash_table->value_destroy_func)
            hash_table->value_destroy_func (node->value);

        node->value = value;
    }
    else
    {
        node->key = key;
        node->value = value;
        node->key_hash = key_hash;

        hash_table->nnodes++;

        if (old_hash == 0)
        {
            /* We replaced an empty node, and not a tombstone */
            hash_table->noccupied++;
            g_hash_table_maybe_resize (hash_table);
        }
    }
}